

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.h
# Opt level: O0

size_t __thiscall
Js::CharClassifier::SkipBiDirectionalChars
          (CharClassifier *this,LPCOLESTR psz,size_t startIndex,size_t length)

{
  bool bVar1;
  size_t local_38;
  size_t count;
  size_t length_local;
  size_t startIndex_local;
  LPCOLESTR psz_local;
  CharClassifier *this_local;
  
  local_38 = 0;
  while ((startIndex < length &&
         (bVar1 = IsBiDirectionalChar(this,(uint)(ushort)psz[startIndex + local_38]), bVar1))) {
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

size_t SkipBiDirectionalChars(_In_z_bytecount_(2 * length) LPCOLESTR psz, _In_ size_t startIndex, _In_ size_t length) const
        {
            size_t count = 0;
            while (startIndex < length)
            {
                if (!IsBiDirectionalChar(psz[startIndex + count]))
                {
                    return count;
                }

                count++;
            }

            return count;
        }